

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extractLaneI64x2(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  undefined3 in_register_00000011;
  LaneArray<2> local_50;
  
  getLanesI64x2(&local_50,this);
  other = std::array<wasm::Literal,_2UL>::at(&local_50,(ulong)CONCAT31(in_register_00000011,index));
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_2UL>::~array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneI64x2(uint8_t index) const {
  return getLanesI64x2().at(index);
}